

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::ProcessGlobalSettings
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  bool bVar1;
  Value *pVVar2;
  Value local_240;
  Value local_218;
  Value local_1f0;
  Value local_1c8;
  Value local_1a0;
  Value local_178;
  Value local_150;
  Value local_128;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_78;
  undefined1 local_50 [8];
  Value obj;
  cmake *cm;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  obj.limit_ = (ptrdiff_t)cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
  Json::Value::Value((Value *)local_50,objectValue);
  cmake::ReportCapabilitiesJson(&local_78,(cmake *)obj.limit_);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kCAPABILITIES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_78);
  Json::Value::~Value(&local_78);
  bVar1 = cmake::GetDebugOutput((cmake *)obj.limit_);
  Json::Value::Value(&local_b0,bVar1);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kDEBUG_OUTPUT_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_b0);
  Json::Value::~Value(&local_b0);
  bVar1 = cmake::GetTrace((cmake *)obj.limit_);
  Json::Value::Value(&local_d8,bVar1);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kTRACE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_d8);
  Json::Value::~Value(&local_d8);
  bVar1 = cmake::GetTraceExpand((cmake *)obj.limit_);
  Json::Value::Value(&local_100,bVar1);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kTRACE_EXPAND_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_100);
  Json::Value::~Value(&local_100);
  bVar1 = cmake::GetWarnUninitialized((cmake *)obj.limit_);
  Json::Value::Value(&local_128,bVar1);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kWARN_UNINITIALIZED_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_128);
  Json::Value::~Value(&local_128);
  bVar1 = cmake::GetWarnUnused((cmake *)obj.limit_);
  Json::Value::Value(&local_150,bVar1);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kWARN_UNUSED_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_150);
  Json::Value::~Value(&local_150);
  bVar1 = cmake::GetWarnUnusedCli((cmake *)obj.limit_);
  Json::Value::Value(&local_178,bVar1);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kWARN_UNUSED_CLI_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_178);
  Json::Value::~Value(&local_178);
  bVar1 = cmake::GetCheckSystemVars((cmake *)obj.limit_);
  Json::Value::Value(&local_1a0,bVar1);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kCHECK_SYSTEM_VARS_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_1a0);
  Json::Value::~Value(&local_1a0);
  Json::Value::Value(&local_1c8,&(this->GeneratorInfo).SourceDirectory);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_1c8);
  Json::Value::~Value(&local_1c8);
  Json::Value::Value(&local_1f0,&(this->GeneratorInfo).BuildDirectory);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_1f0);
  Json::Value::~Value(&local_1f0);
  Json::Value::Value(&local_218,&(this->GeneratorInfo).GeneratorName);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_218);
  Json::Value::~Value(&local_218);
  Json::Value::Value(&local_240,&(this->GeneratorInfo).ExtraGeneratorName);
  pVVar2 = Json::Value::operator[]((Value *)local_50,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar2,&local_240);
  Json::Value::~Value(&local_240);
  cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)local_50);
  Json::Value::~Value((Value *)local_50);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessGlobalSettings(
  const cmServerRequest& request)
{
  cmake* cm = this->CMakeInstance();
  Json::Value obj = Json::objectValue;

  // Capabilities information:
  obj[kCAPABILITIES_KEY] = cm->ReportCapabilitiesJson();

  obj[kDEBUG_OUTPUT_KEY] = cm->GetDebugOutput();
  obj[kTRACE_KEY] = cm->GetTrace();
  obj[kTRACE_EXPAND_KEY] = cm->GetTraceExpand();
  obj[kWARN_UNINITIALIZED_KEY] = cm->GetWarnUninitialized();
  obj[kWARN_UNUSED_KEY] = cm->GetWarnUnused();
  obj[kWARN_UNUSED_CLI_KEY] = cm->GetWarnUnusedCli();
  obj[kCHECK_SYSTEM_VARS_KEY] = cm->GetCheckSystemVars();

  obj[kSOURCE_DIRECTORY_KEY] = this->GeneratorInfo.SourceDirectory;
  obj[kBUILD_DIRECTORY_KEY] = this->GeneratorInfo.BuildDirectory;

  // Currently used generator:
  obj[kGENERATOR_KEY] = this->GeneratorInfo.GeneratorName;
  obj[kEXTRA_GENERATOR_KEY] = this->GeneratorInfo.ExtraGeneratorName;

  return request.Reply(obj);
}